

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteTest.h
# Opt level: O3

void __thiscall
oout::SuiteTest::
SuiteTest<oout::Test_const,oout::ContainTest,oout::ContainTest,oout::ContainTest,oout::ContainTest>
          (SuiteTest *this,shared_ptr<const_oout::Test> *test1,shared_ptr<const_oout::Test> *tests,
          shared_ptr<oout::ContainTest> *tests_1,shared_ptr<oout::ContainTest> *tests_2,
          shared_ptr<oout::ContainTest> *tests_3,shared_ptr<oout::ContainTest> *tests_4)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Test>_> __l;
  allocator_type local_89;
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  local_88;
  shared_ptr<const_oout::Test> local_70;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (test1->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_70.super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_60 = (tests->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58 = (tests->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_58->_M_use_count = local_58->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_58->_M_use_count = local_58->_M_use_count + 1;
    }
  }
  local_50 = (tests_1->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = (tests_1->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  local_40 = (tests_2->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38 = (tests_2->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  local_30 = (tests_3->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (tests_3->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  local_20 = (tests_4->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18 = (tests_4->super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  __l._M_len = 6;
  __l._M_array = &local_70;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>::list
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)&local_88,__l,&local_89);
  SuiteTest(this,(list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                  *)&local_88);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  ::_M_clear(&local_88);
  lVar1 = 0x60;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_88._M_impl._M_node._M_size + lVar1);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  return;
}

Assistant:

explicit SuiteTest(
			const std::shared_ptr<const Test> &test1,
			const std::shared_ptr<T> & ... tests
		) : SuiteTest(std::list<std::shared_ptr<const Test>>{
			test1, tests...
		})
	{
	}